

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# snappy.cc
# Opt level: O1

pair<const_unsigned_char_*,_long>
duckdb_snappy::DecompressBranchless<char*>
          (uint8_t *ip,uint8_t *ip_limit,ptrdiff_t op,char *op_base,ptrdiff_t op_limit_min_slop)

{
  byte bVar1;
  bool bVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  uint *puVar6;
  uint *puVar7;
  ptrdiff_t pVar8;
  int iVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  uint *puVar13;
  ulong uVar14;
  long lVar15;
  ulong uVar16;
  ulong uVar17;
  int iVar18;
  uint *puVar19;
  ulong uVar20;
  bool bVar21;
  pair<const_unsigned_char_*,_long> pVar22;
  uint8_t safe_source [64];
  ushort local_80 [4];
  uint local_78 [18];
  
  if (op < op_limit_min_slop + -0x40 && 0x82 < (long)ip_limit - (long)ip) {
    uVar11 = (ulong)*ip;
    puVar6 = (uint *)(ip + 1);
    puVar13 = local_78;
    uVar20 = 0;
    do {
      bVar2 = false;
      puVar7 = puVar6;
      pVar8 = op;
      iVar18 = 0;
      do {
        lVar15 = uVar11 * 2;
        uVar16 = (ulong)*(short *)((anonymous_namespace)::kLengthMinusOffset + lVar15);
        uVar12 = (ulong)((uint)uVar11 & 3);
        bVar21 = (uVar11 & 3) != 0;
        puVar6 = (uint *)((long)puVar7 + (uVar11 >> 2) + 2);
        puVar19 = (uint *)((long)puVar7 + uVar12 + 1);
        bVar1 = *(byte *)((long)puVar6 + -1);
        if (bVar21) {
          bVar1 = *(byte *)((long)puVar19 + -1);
        }
        uVar11 = (ulong)bVar1;
        if (!bVar21) {
          puVar19 = puVar6;
        }
        uVar10 = uVar16 & 0xff;
        local_80[0] = 0;
        local_80[1] = 0xff;
        local_80[2] = 0xffff;
        local_80[3] = 0;
        uVar17 = (ulong)((uint)*(ushort *)((long)local_78 + uVar12 * 2 + -8) & *puVar7);
        uVar14 = uVar16 - uVar17;
        if (uVar14 == 0 || (long)uVar16 < (long)uVar17) {
          op = uVar20 + pVar8;
          lVar15 = (op - uVar10) + uVar14;
          if (lVar15 < 0) {
            if (uVar12 == 0) {
              uVar3 = *(undefined8 *)puVar13;
              uVar4 = *(undefined8 *)(puVar13 + 2);
              uVar5 = *(undefined8 *)(puVar13 + 6);
              *(undefined8 *)(op_base + pVar8 + 0x10) = *(undefined8 *)(puVar13 + 4);
              *(undefined8 *)(op_base + pVar8 + 0x10 + 8) = uVar5;
              *(undefined8 *)(op_base + pVar8) = uVar3;
              *(undefined8 *)(op_base + pVar8 + 8) = uVar4;
              iVar9 = 6;
              puVar6 = puVar7;
              if (0x20 < uVar20) goto LAB_002e635a;
              bVar21 = false;
              puVar13 = puVar7;
            }
            else {
              iVar9 = 7;
              bVar21 = true;
              op = pVar8;
              uVar10 = uVar20;
            }
          }
          else {
            puVar6 = (uint *)(op_base + lVar15);
            if (uVar12 == 0) {
              puVar6 = puVar7;
            }
            uVar3 = *(undefined8 *)puVar13;
            uVar4 = *(undefined8 *)(puVar13 + 2);
            uVar5 = *(undefined8 *)(puVar13 + 6);
            *(undefined8 *)(op_base + pVar8 + 0x10) = *(undefined8 *)(puVar13 + 4);
            *(undefined8 *)(op_base + pVar8 + 0x10 + 8) = uVar5;
            *(undefined8 *)(op_base + pVar8) = uVar3;
            *(undefined8 *)(op_base + pVar8 + 8) = uVar4;
            iVar9 = 0;
            if (uVar20 < 0x21) {
              bVar21 = false;
              puVar13 = puVar6;
            }
            else {
LAB_002e635a:
              uVar3 = *(undefined8 *)(puVar13 + 8);
              uVar4 = *(undefined8 *)(puVar13 + 10);
              uVar5 = *(undefined8 *)(puVar13 + 0xe);
              *(undefined8 *)(op_base + pVar8 + 0x30) = *(undefined8 *)(puVar13 + 0xc);
              *(undefined8 *)(op_base + pVar8 + 0x30 + 8) = uVar5;
              *(undefined8 *)(op_base + pVar8 + 0x20) = uVar3;
              *(undefined8 *)(op_base + pVar8 + 0x20 + 8) = uVar4;
              bVar21 = false;
              puVar13 = puVar6;
            }
          }
          puVar6 = puVar19;
          uVar20 = uVar10;
          if (bVar21) {
            iVar9 = 8;
            puVar6 = puVar7;
          }
        }
        else {
          iVar9 = 8;
          puVar6 = puVar7;
          op = pVar8;
          if (-1 < (char)*(short *)((anonymous_namespace)::kLengthMinusOffset + lVar15)) {
            uVar3 = *(undefined8 *)puVar13;
            uVar4 = *(undefined8 *)(puVar13 + 2);
            uVar5 = *(undefined8 *)(puVar13 + 6);
            *(undefined8 *)(op_base + pVar8 + 0x10) = *(undefined8 *)(puVar13 + 4);
            *(undefined8 *)(op_base + pVar8 + 0x10 + 8) = uVar5;
            *(undefined8 *)(op_base + pVar8) = uVar3;
            *(undefined8 *)(op_base + pVar8 + 8) = uVar4;
            if (0x20 < uVar20) {
              uVar3 = *(undefined8 *)(puVar13 + 8);
              uVar4 = *(undefined8 *)(puVar13 + 10);
              uVar5 = *(undefined8 *)(puVar13 + 0xe);
              *(undefined8 *)(op_base + pVar8 + 0x30) = *(undefined8 *)(puVar13 + 0xc);
              *(undefined8 *)(op_base + pVar8 + 0x38) = uVar5;
              *(undefined8 *)(op_base + pVar8 + 0x20) = uVar3;
              *(undefined8 *)(op_base + pVar8 + 0x28) = uVar4;
            }
            op = uVar20 + pVar8;
            if (-1 < (long)((op - uVar10) + uVar14)) {
              if (uVar10 - uVar14 < 0x10) {
                if (uVar10 == uVar14) goto LAB_002e62cc;
                lVar15 = 0;
                do {
                  op_base[lVar15 + op] =
                       op_base[lVar15 + (((uVar16 + uVar20 + pVar8) - uVar17) - uVar10)];
                  lVar15 = lVar15 + 1;
                } while (lVar15 != 0x10);
                if ((anonymous_namespace)::Copy64BytesWithPatternExtension(char*,unsigned_long)::
                    pattern_sizes == '\0') {
                  DecompressBranchless<char*>();
                }
                bVar1 = *(byte *)((long)&(anonymous_namespace)::
                                         Copy64BytesWithPatternExtension(char*,unsigned_long)::
                                         pattern_sizes + (uVar10 - uVar14));
                lVar15 = 0x10;
                do {
                  uVar3 = *(undefined8 *)(op_base + lVar15 + ((uVar20 + pVar8) - (ulong)bVar1) + 8);
                  *(undefined8 *)(op_base + lVar15 + op) =
                       *(undefined8 *)(op_base + lVar15 + ((uVar20 + pVar8) - (ulong)bVar1));
                  *(undefined8 *)(op_base + lVar15 + op + 8) = uVar3;
                  lVar15 = lVar15 + 0x10;
                } while (lVar15 != 0x40);
              }
              else {
                DecompressBranchless<char*>();
              }
              op = uVar10 + op;
              iVar9 = 6;
              puVar7 = puVar19;
            }
LAB_002e62cc:
            puVar13 = local_78;
            puVar6 = puVar7;
            uVar20 = 0;
          }
        }
        if ((iVar9 != 6) && (iVar9 != 0)) break;
        bVar21 = iVar18 == 0;
        bVar2 = !bVar21;
        puVar7 = puVar6;
        pVar8 = op;
        iVar18 = iVar18 + 1;
      } while (bVar21);
    } while (((bVar2) && (puVar6 < ip_limit + -0x81)) &&
            ((long)(uVar20 + op) < op_limit_min_slop + -0x40));
    ip = (uint8_t *)((long)puVar6 + -1);
  }
  else {
    puVar13 = local_78;
    uVar20 = 0;
  }
  if (uVar20 != 0) {
    uVar3 = *(undefined8 *)puVar13;
    uVar4 = *(undefined8 *)(puVar13 + 2);
    uVar5 = *(undefined8 *)(puVar13 + 6);
    *(undefined8 *)(op_base + op + 0x10) = *(undefined8 *)(puVar13 + 4);
    *(undefined8 *)(op_base + op + 0x10 + 8) = uVar5;
    *(undefined8 *)(op_base + op) = uVar3;
    *(undefined8 *)(op_base + op + 8) = uVar4;
    if (0x20 < uVar20) {
      uVar3 = *(undefined8 *)(puVar13 + 8);
      uVar4 = *(undefined8 *)(puVar13 + 10);
      uVar5 = *(undefined8 *)(puVar13 + 0xe);
      *(undefined8 *)(op_base + op + 0x30) = *(undefined8 *)(puVar13 + 0xc);
      *(undefined8 *)(op_base + op + 0x38) = uVar5;
      *(undefined8 *)(op_base + op + 0x20) = uVar3;
      *(undefined8 *)(op_base + op + 0x28) = uVar4;
    }
    op = op + uVar20;
  }
  pVar22.second = op;
  pVar22.first = ip;
  return pVar22;
}

Assistant:

std::pair<const uint8_t*, ptrdiff_t> DecompressBranchless(
    const uint8_t* ip, const uint8_t* ip_limit, ptrdiff_t op, T op_base,
    ptrdiff_t op_limit_min_slop) {
  // If deferred_src is invalid point it here.
  uint8_t safe_source[64];
  const void* deferred_src;
  size_t deferred_length;
  ClearDeferred(&deferred_src, &deferred_length, safe_source);

  // We unroll the inner loop twice so we need twice the spare room.
  op_limit_min_slop -= kSlopBytes;
  if (2 * (kSlopBytes + 1) < ip_limit - ip && op < op_limit_min_slop) {
    const uint8_t* const ip_limit_min_slop = ip_limit - 2 * kSlopBytes - 1;
    ip++;
    // ip points just past the tag and we are touching at maximum kSlopBytes
    // in an iteration.
    size_t tag = ip[-1];
#if defined(__clang__) && defined(__aarch64__)
    // Workaround for https://bugs.llvm.org/show_bug.cgi?id=51317
    // when loading 1 byte, clang for aarch64 doesn't realize that it(ldrb)
    // comes with free zero-extension, so clang generates another
    // 'and xn, xm, 0xff' before it use that as the offset. This 'and' is
    // redundant and can be removed by adding this dummy asm, which gives
    // clang a hint that we're doing the zero-extension at the load.
    asm("" ::"r"(tag));
#endif
    do {
      // The throughput is limited by instructions, unrolling the inner loop
      // twice reduces the amount of instructions checking limits and also
      // leads to reduced mov's.

      SNAPPY_PREFETCH(ip + 128);
      for (int i = 0; i < 2; i++) {
        const uint8_t* old_ip = ip;
        assert(tag == ip[-1]);
        // For literals tag_type = 0, hence we will always obtain 0 from
        // ExtractLowBytes. For literals offset will thus be kLiteralOffset.
        ptrdiff_t len_minus_offset = kLengthMinusOffset[tag];
        uint32_t next;
#if defined(__aarch64__)
        size_t tag_type = AdvanceToNextTagARMOptimized(&ip, &tag);
        // We never need more than 16 bits. Doing a Load16 allows the compiler
        // to elide the masking operation in ExtractOffset.
        next = LittleEndian::Load16(old_ip);
#else
        size_t tag_type = AdvanceToNextTagX86Optimized(&ip, &tag);
        next = LittleEndian::Load32(old_ip);
#endif
        size_t len = len_minus_offset & 0xFF;
        ptrdiff_t extracted = ExtractOffset(next, tag_type);
        ptrdiff_t len_min_offset = len_minus_offset - extracted;
        if (SNAPPY_PREDICT_FALSE(len_minus_offset > extracted)) {
          if (SNAPPY_PREDICT_FALSE(len & 0x80)) {
            // Exceptional case (long literal or copy 4).
            // Actually doing the copy here is negatively impacting the main
            // loop due to compiler incorrectly allocating a register for
            // this fallback. Hence we just break.
          break_loop:
            ip = old_ip;
            goto exit;
          }
          // Only copy-1 or copy-2 tags can get here.
          assert(tag_type == 1 || tag_type == 2);
          std::ptrdiff_t delta = (op + deferred_length) + len_min_offset - len;
          // Guard against copies before the buffer start.
          // Execute any deferred MemCopy since we write to dst here.
          MemCopy64(op_base + op, deferred_src, deferred_length);
          op += deferred_length;
          ClearDeferred(&deferred_src, &deferred_length, safe_source);
          if (SNAPPY_PREDICT_FALSE(delta < 0 ||
                                  !Copy64BytesWithPatternExtension(
                                      op_base + op, len - len_min_offset))) {
            goto break_loop;
          }
          // We aren't deferring this copy so add length right away.
          op += len;
          continue;
        }
        std::ptrdiff_t delta = (op + deferred_length) + len_min_offset - len;
        if (SNAPPY_PREDICT_FALSE(delta < 0)) {
          // Due to the spurious offset in literals have this will trigger
          // at the start of a block when op is still smaller than 256.
          if (tag_type != 0) goto break_loop;
          MemCopy64(op_base + op, deferred_src, deferred_length);
          op += deferred_length;
          DeferMemCopy(&deferred_src, &deferred_length, old_ip, len);
          continue;
        }

        // For copies we need to copy from op_base + delta, for literals
        // we need to copy from ip instead of from the stream.
        const void* from =
            tag_type ? reinterpret_cast<void*>(op_base + delta) : old_ip;
        MemCopy64(op_base + op, deferred_src, deferred_length);
        op += deferred_length;
        DeferMemCopy(&deferred_src, &deferred_length, from, len);
      }
    } while (ip < ip_limit_min_slop &&
             static_cast<ptrdiff_t>(op + deferred_length) < op_limit_min_slop);
  exit:
    ip--;
    assert(ip <= ip_limit);
  }
  // If we deferred a copy then we can perform.  If we are up to date then we
  // might not have enough slop bytes and could run past the end.
  if (deferred_length) {
    MemCopy64(op_base + op, deferred_src, deferred_length);
    op += deferred_length;
    ClearDeferred(&deferred_src, &deferred_length, safe_source);
  }
  return {ip, op};
}